

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *args_4;
  ModuleHeaderSyntax *pMVar1;
  ParameterPortListSyntax *local_70;
  DeepCloneVisitor visitor;
  Token local_58;
  Token local_48;
  Token local_38;
  SyntaxNode *local_28;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x38),(BumpAllocator *)__child_stack);
  args_4 = deepClone<slang::syntax::PackageImportDeclarationSyntax>
                     ((SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)(__fn + 0x48),
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x80) == (SyntaxNode *)0x0) {
    local_70 = (ParameterPortListSyntax *)0x0;
  }
  else {
    local_70 = (ParameterPortListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x80),&visitor,(BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x88) == (SyntaxNode *)0x0) {
    local_28 = (SyntaxNode *)0x0;
  }
  else {
    local_28 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x88),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x90),(BumpAllocator *)__child_stack);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::ModuleHeaderSyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::PackageImportDeclarationSyntax>&,slang::syntax::ParameterPortListSyntax*,slang::syntax::PortListSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,&local_38,&local_48,
                      &local_58,args_4,&local_70,(PortListSyntax **)&local_28,(Token *)&visitor);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const ModuleHeaderSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ModuleHeaderSyntax>(
        node.kind,
        node.moduleKeyword.deepClone(alloc),
        node.lifetime.deepClone(alloc),
        node.name.deepClone(alloc),
        *deepClone(node.imports, alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        node.ports ? deepClone(*node.ports, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}